

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDeterministicKey.cpp
# Opt level: O3

bignum __thiscall jbcoin::generateRootDeterministicKey(jbcoin *this,uint128 *seed)

{
  int iVar1;
  BIGNUM *a;
  bignum extraout_RAX;
  array<unsigned_char,_20UL> *extraout_RDX;
  array<unsigned_char,_20UL> *args;
  array<unsigned_char,_20UL> *extraout_RDX_00;
  array<unsigned_char,_20UL> *extraout_RDX_01;
  int iVar2;
  array<unsigned_char,_20UL> buf;
  result_type root;
  int local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58;
  undefined1 local_57;
  undefined1 local_56;
  undefined1 local_55;
  result_type local_50;
  
  a = BN_new();
  *(BIGNUM **)this = a;
  if (a != (BIGNUM *)0x0) {
    iVar2 = 0;
    args = extraout_RDX;
    do {
      do {
        local_68 = *(undefined8 *)seed->pn;
        uStack_60 = *(undefined8 *)(seed->pn + 2);
        local_58 = (undefined1)((uint)iVar2 >> 0x18);
        local_57 = (undefined1)((uint)iVar2 >> 0x10);
        local_56 = (undefined1)((uint)iVar2 >> 8);
        local_55 = (undefined1)iVar2;
        iVar2 = iVar2 + 1;
        local_6c = iVar2;
        sha512Half<std::array<unsigned_char,20ul>>(&local_50,(jbcoin *)&local_68,args);
        beast::secure_erase<void>((jbcoin *)&local_68,0x14);
        openssl::bignum::assign((bignum *)this,(uint8_t *)&local_50,0x20);
        beast::secure_erase<void>(&local_50,0x20);
        iVar1 = BN_is_zero(a);
        args = extraout_RDX_00;
      } while (iVar1 != 0);
      iVar1 = BN_cmp(a,DAT_002e09e0);
      args = extraout_RDX_01;
    } while (-1 < iVar1);
    beast::secure_erase<void>(&local_6c,4);
    return (bignum)extraout_RAX.ptr;
  }
  Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"BN_new() failed");
}

Assistant:

static bignum generateRootDeterministicKey (uint128 const& seed)
{
    // find non-zero private key less than the curve's order
    bignum privKey;
    std::uint32_t seq = 0;

    do
    {
        // buf: 0                seed               16  seq  20
        //      |<--------------------------------->|<------>|
        std::array<std::uint8_t, 20> buf;
        std::copy(seed.begin(), seed.end(), buf.begin());
        copy_uint32 (buf.begin() + 16, seq++);
        auto root = sha512Half(buf);
        beast::secure_erase(buf.data(), buf.size());
        privKey.assign (root.data(), root.size());
        beast::secure_erase(root.data(), root.size());
    }
    while (privKey.is_zero() || privKey >= secp256k1curve.order);
    beast::secure_erase(&seq, sizeof(seq));
    return privKey;
}